

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O2

void __thiscall
Assimp::OptimizeMeshesProcess::ProcessNode(OptimizeMeshesProcess *this,aiNode *pNode)

{
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *this_00;
  uint b;
  uint *puVar1;
  pointer pMVar2;
  aiMesh *paVar3;
  bool bVar4;
  uint verts;
  uint i;
  uint uVar5;
  uint uVar6;
  aiMesh **__x;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  aiMesh *out;
  uint local_74;
  aiMesh *local_38;
  
  this_00 = &this->merge_list;
  uVar9 = 0;
  while( true ) {
    if (pNode->mNumMeshes <= uVar9) {
      for (uVar9 = 0; uVar9 < pNode->mNumChildren; uVar9 = uVar9 + 1) {
        ProcessNode(this,pNode->mChildren[uVar9]);
      }
      return;
    }
    puVar1 = pNode->mMeshes;
    pMVar2 = (this->meshes).
             super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pMVar2[puVar1[uVar9]].instance_cnt < 2) break;
    uVar6 = pMVar2[puVar1[uVar9]].output_id;
LAB_003bf7e9:
    puVar1[uVar9] = uVar6;
    uVar9 = uVar9 + 1;
  }
  verts = 0;
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(this_00,0);
  uVar6 = pNode->mNumMeshes;
  local_74 = 0;
  uVar8 = uVar9;
  do {
    pMVar2 = (this->meshes).
             super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (ulong)((int)uVar8 + 1);
    while( true ) {
      uVar5 = (int)uVar8 + 1;
      if (uVar6 <= uVar5) {
        __x = this->mScene->mMeshes + puVar1[uVar9];
        if ((this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(this_00,__x);
          __x = &local_38;
          SceneCombiner::MergeMeshes
                    (__x,0,(const_iterator)
                           (this->merge_list).
                           super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                           super__Vector_impl_data._M_start,
                     (const_iterator)
                     (this->merge_list).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        }
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&this->output,__x);
        uVar6 = (int)((ulong)((long)(this->output).
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(this->output).
                                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3) - 1;
        goto LAB_003bf7e9;
      }
      b = pNode->mMeshes[uVar7];
      if ((pMVar2[b].instance_cnt == 1) &&
         (bVar4 = CanJoin(this,puVar1[uVar9],b,verts,local_74), bVar4)) break;
      uVar7 = uVar7 + 1;
      uVar8 = (ulong)uVar5;
    }
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(this_00,this->mScene->mMeshes + b);
    paVar3 = this->mScene->mMeshes[b];
    verts = verts + paVar3->mNumVertices;
    local_74 = local_74 + paVar3->mNumFaces;
    pNode->mMeshes[uVar7] = pNode->mMeshes[pNode->mNumMeshes - 1];
    uVar6 = pNode->mNumMeshes - 1;
    pNode->mNumMeshes = uVar6;
  } while( true );
}

Assistant:

void OptimizeMeshesProcess::ProcessNode( aiNode* pNode)
{
    for (unsigned int i = 0; i < pNode->mNumMeshes;++i) {
        unsigned int& im = pNode->mMeshes[i];

        if (meshes[im].instance_cnt > 1) {
            im = meshes[im].output_id;
        }
        else  {
            merge_list.resize( 0 );
            unsigned int verts = 0, faces = 0;

            // Find meshes to merge with us
            for (unsigned int a = i+1; a < pNode->mNumMeshes;++a) {
                unsigned int am = pNode->mMeshes[a];
                if (meshes[am].instance_cnt == 1 && CanJoin(im,am,verts,faces)) {

                    merge_list.push_back(mScene->mMeshes[am]);
                    verts += mScene->mMeshes[am]->mNumVertices;
                    faces += mScene->mMeshes[am]->mNumFaces;

                    pNode->mMeshes[a] = pNode->mMeshes[pNode->mNumMeshes - 1];
                    --pNode->mNumMeshes;
                    --a;
                }
            }

            // and merge all meshes which we found, replace the old ones
            if (!merge_list.empty()) {
                merge_list.push_back(mScene->mMeshes[im]);

                aiMesh* out;
                SceneCombiner::MergeMeshes(&out,0,merge_list.begin(),merge_list.end());
                output.push_back(out);
            } else {
                output.push_back(mScene->mMeshes[im]);
            }
            im = static_cast<unsigned int>(output.size()-1);
        }
    }


    for( unsigned int i = 0; i < pNode->mNumChildren; ++i ) {
        ProcessNode( pNode->mChildren[ i ] );
    }
}